

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constr_SET_OF.c
# Opt level: O0

asn_enc_rval_t *
SET_OF_encode_xer(asn_TYPE_descriptor_t *td,void *sptr,int ilevel,xer_encoder_flags_e flags,
                 asn_app_consume_bytes_f *cb,void *app_key)

{
  char *__s;
  int iVar1;
  undefined8 *puVar2;
  int in_ECX;
  size_t sVar3;
  long *in_RDX;
  asn_TYPE_descriptor_s *in_RSI;
  asn_enc_rval_t *in_RDI;
  xer_encoder_flags_e in_R8D;
  asn_app_consume_bytes_f *in_R9;
  undefined8 *in_stack_00000008;
  asn_enc_rval_t *tmp_error;
  ssize_t control_size;
  xer_tmp_enc_t *end;
  xer_tmp_enc_t *enc;
  int tmp_i_2;
  int tmp_nl_2;
  int tmp_level_2;
  size_t len;
  char *name;
  int tmp_i_1;
  int tmp_nl_1;
  int tmp_level_1;
  int tmp_i;
  int tmp_nl;
  int tmp_level;
  void *memb_ptr;
  asn_enc_rval_t tmper;
  int i;
  asn_app_consume_bytes_f *original_cb;
  void *original_app_key;
  size_t encs_count;
  xer_tmp_enc_t *encs;
  int xcan;
  size_t mlen;
  char *mname;
  asn_anonymous_set_ *list;
  asn_TYPE_member_t *elm;
  asn_SET_OF_specifics_t *specs;
  asn_enc_rval_t er;
  char *local_150;
  char *local_148;
  size_t local_140;
  char *local_138;
  char *local_130;
  undefined8 *local_108;
  int local_fc;
  int local_f4;
  asn_enc_rval_t local_e0;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  void *local_b0;
  long local_a8;
  asn_TYPE_descriptor_s *local_a0;
  long *local_98;
  int local_8c;
  asn_app_consume_bytes_f *local_88;
  undefined8 *local_80;
  size_t local_78;
  undefined8 *local_70;
  xer_encoder_flags_e local_64;
  size_t local_60;
  char *local_58;
  long *local_50;
  asn_TYPE_member_s *local_48;
  void *local_40;
  long local_38;
  asn_TYPE_descriptor_s *local_30;
  long *local_28;
  asn_app_consume_bytes_f *local_20;
  xer_encoder_flags_e local_18;
  int local_14;
  long *local_10;
  asn_TYPE_descriptor_s *local_8;
  
  local_40 = in_RSI->specifics;
  local_48 = in_RSI->elements;
  if (*(int *)((long)local_40 + 8) == 0) {
    if (*local_48->name == '\0') {
      local_138 = local_48->type->xml_tag;
    }
    else {
      local_138 = local_48->name;
    }
    local_130 = local_138;
  }
  else {
    local_130 = (char *)0x0;
  }
  local_58 = local_130;
  local_50 = in_RDX;
  local_20 = in_R9;
  local_18 = in_R8D;
  local_14 = in_ECX;
  local_10 = in_RDX;
  local_8 = in_RSI;
  if (local_130 == (char *)0x0) {
    local_140 = 0;
  }
  else {
    local_140 = strlen(local_130);
  }
  local_60 = local_140;
  local_64 = local_18 & XER_F_CANONICAL;
  local_70 = (undefined8 *)0x0;
  local_78 = 0;
  local_80 = in_stack_00000008;
  local_88 = local_20;
  if (local_10 == (long *)0x0) {
    in_RDI->encoded = -1;
    in_RDI->failed_type = local_8;
    in_RDI->structure_ptr = (void *)0x0;
    if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
      local_148 = "";
    }
    else {
      local_148 = local_8->name;
    }
    ASN_DEBUG("Failed to encode element %s",local_148);
    return in_RDI;
  }
  if (local_64 != 0) {
    local_70 = (undefined8 *)malloc((long)(int)local_50[1] * 0x18);
    if (local_70 == (undefined8 *)0x0) {
      in_RDI->encoded = -1;
      in_RDI->failed_type = local_8;
      in_RDI->structure_ptr = local_10;
      if (local_8 == (asn_TYPE_descriptor_s *)0x0) {
        local_150 = "";
      }
      else {
        local_150 = local_8->name;
      }
      ASN_DEBUG("Failed to encode element %s",local_150);
      return in_RDI;
    }
    local_20 = SET_OF_encode_xer_callback;
  }
  local_38 = 0;
  for (local_8c = 0; local_8c < (int)local_50[1]; local_8c = local_8c + 1) {
    local_b0 = *(void **)(*local_50 + (long)local_8c * 8);
    if (local_b0 != (void *)0x0) {
      if (local_70 != (undefined8 *)0x0) {
        memset(local_70 + local_78 * 3,0,0x18);
        in_stack_00000008 = local_70 + local_78 * 3;
        local_78 = local_78 + 1;
      }
      if (local_58 != (char *)0x0) {
        if (local_64 == 0) {
          local_b4 = local_14;
          local_b8 = 1;
          iVar1 = (*local_20)("\n",1,in_stack_00000008);
          if (iVar1 < 0) goto LAB_001608cc;
          if (local_b4 < 0) {
            local_b4 = 0;
          }
          for (local_bc = 0; local_bc < local_b4; local_bc = local_bc + 1) {
            iVar1 = (*local_20)("    ",4,in_stack_00000008);
            if (iVar1 < 0) goto LAB_001608cc;
          }
          local_38 = (local_b8 + local_b4 * 4) + local_38;
        }
        iVar1 = (*local_20)("<",1,in_stack_00000008);
        if (((iVar1 < 0) || (iVar1 = (*local_20)(local_58,local_60,in_stack_00000008), iVar1 < 0))
           || (iVar1 = (*local_20)(">",1,in_stack_00000008), iVar1 < 0)) goto LAB_001608cc;
      }
      if ((local_64 == 0) && (*(int *)((long)local_40 + 8) == 1)) {
        local_c0 = local_14 + 1;
        local_c4 = 1;
        iVar1 = (*local_20)("\n",1,in_stack_00000008);
        if (iVar1 < 0) goto LAB_001608cc;
        if (local_c0 < 0) {
          local_c0 = 0;
        }
        for (local_c8 = 0; local_c8 < local_c0; local_c8 = local_c8 + 1) {
          iVar1 = (*local_20)("    ",4,in_stack_00000008);
          if (iVar1 < 0) goto LAB_001608cc;
        }
        local_38 = (local_c4 + local_c0 * 4) + local_38;
      }
      (*local_48->type->xer_encoder)
                (&local_e0,local_48->type,local_b0,
                 local_14 + (uint)(*(int *)((long)local_40 + 8) != 2),local_18,local_20,
                 in_stack_00000008);
      local_a8 = local_e0.encoded;
      local_a0 = local_e0.failed_type;
      local_98 = (long *)local_e0.structure_ptr;
      if (local_e0.encoded == -1) {
        local_8 = local_e0.failed_type;
        local_10 = (long *)local_e0.structure_ptr;
        goto LAB_001608cc;
      }
      if ((local_e0.encoded == 0) && (*(int *)((long)local_40 + 8) != 0)) {
        __s = local_48->type->xml_tag;
        sVar3 = strlen(__s);
        iVar1 = (*local_20)("<",1,in_stack_00000008);
        if ((iVar1 < 0) ||
           ((iVar1 = (*local_20)(__s,sVar3,in_stack_00000008), iVar1 < 0 ||
            (iVar1 = (*local_20)("/>",2,in_stack_00000008), iVar1 < 0)))) goto LAB_001608cc;
      }
      if (local_58 != (char *)0x0) {
        iVar1 = (*local_20)("</",2,in_stack_00000008);
        if (((iVar1 < 0) || (iVar1 = (*local_20)(local_58,local_60,in_stack_00000008), iVar1 < 0))
           || (iVar1 = (*local_20)(">",1,in_stack_00000008), iVar1 < 0)) goto LAB_001608cc;
        local_38 = local_38 + 5;
      }
      local_38 = local_60 * 2 + local_a8 + local_38;
    }
  }
  if (local_64 == 0) {
    local_f4 = local_14 + -1;
    iVar1 = (*local_20)("\n",1,in_stack_00000008);
    if (iVar1 < 0) {
LAB_001608cc:
      local_38 = -1;
      local_30 = local_8;
      local_28 = local_10;
      goto LAB_001608f8;
    }
    if (local_f4 < 0) {
      local_f4 = 0;
    }
    for (local_fc = 0; local_fc < local_f4; local_fc = local_fc + 1) {
      iVar1 = (*local_20)("    ",4,in_stack_00000008);
      if (iVar1 < 0) goto LAB_001608cc;
    }
    local_38 = (local_f4 * 4 + 1) + local_38;
  }
  if (local_70 != (undefined8 *)0x0) {
    local_108 = local_70;
    puVar2 = local_70 + local_78 * 3;
    local_20 = local_88;
    in_stack_00000008 = local_80;
    qsort(local_70,local_78,0x18,SET_OF_xer_order);
    for (; local_108 < puVar2; local_108 = local_108 + 3) {
      iVar1 = (*local_20)((void *)*local_108,local_108[1],in_stack_00000008);
      if (iVar1 < 0) goto LAB_001608cc;
      free((void *)*local_108);
      *local_108 = 0;
    }
  }
LAB_001608f8:
  if (local_70 != (undefined8 *)0x0) {
    while (sVar3 = local_78 - 1, local_78 != 0) {
      local_78 = sVar3;
      if (local_70[sVar3 * 3] != 0) {
        free((void *)local_70[sVar3 * 3]);
      }
    }
    local_78 = sVar3;
    free(local_70);
  }
  in_RDI->encoded = local_38;
  in_RDI->failed_type = (asn_TYPE_descriptor_s *)0x0;
  in_RDI->structure_ptr = (void *)0x0;
  return in_RDI;
}

Assistant:

asn_enc_rval_t
SET_OF_encode_xer(asn_TYPE_descriptor_t *td, void *sptr,
	int ilevel, enum xer_encoder_flags_e flags,
		asn_app_consume_bytes_f *cb, void *app_key) {
	asn_enc_rval_t er;
	asn_SET_OF_specifics_t *specs = (asn_SET_OF_specifics_t *)td->specifics;
	asn_TYPE_member_t *elm = td->elements;
	asn_anonymous_set_ *list = _A_SET_FROM_VOID(sptr);
	const char *mname = specs->as_XMLValueList
		? 0 : ((*elm->name) ? elm->name : elm->type->xml_tag);
	size_t mlen = mname ? strlen(mname) : 0;
	int xcan = (flags & XER_F_CANONICAL);
	xer_tmp_enc_t *encs = 0;
	size_t encs_count = 0;
	void *original_app_key = app_key;
	asn_app_consume_bytes_f *original_cb = cb;
	int i;

	if(!sptr) ASN__ENCODE_FAILED;

	if(xcan) {
		encs = (xer_tmp_enc_t *)MALLOC(list->count * sizeof(encs[0]));
		if(!encs) ASN__ENCODE_FAILED;
		cb = SET_OF_encode_xer_callback;
	}

	er.encoded = 0;

	for(i = 0; i < list->count; i++) {
		asn_enc_rval_t tmper;

		void *memb_ptr = list->array[i];
		if(!memb_ptr) continue;

		if(encs) {
			memset(&encs[encs_count], 0, sizeof(encs[0]));
			app_key = &encs[encs_count];
			encs_count++;
		}

		if(mname) {
			if(!xcan) ASN__TEXT_INDENT(1, ilevel);
			ASN__CALLBACK3("<", 1, mname, mlen, ">", 1);
		}

		if(!xcan && specs->as_XMLValueList == 1)
			ASN__TEXT_INDENT(1, ilevel + 1);
		tmper = elm->type->xer_encoder(elm->type, memb_ptr,
				ilevel + (specs->as_XMLValueList != 2),
				flags, cb, app_key);
		if(tmper.encoded == -1) {
			td = tmper.failed_type;
			sptr = tmper.structure_ptr;
			goto cb_failed;
		}
		if(tmper.encoded == 0 && specs->as_XMLValueList) {
			const char *name = elm->type->xml_tag;
			size_t len = strlen(name);
			ASN__CALLBACK3("<", 1, name, len, "/>", 2);
		}

		if(mname) {
			ASN__CALLBACK3("</", 2, mname, mlen, ">", 1);
			er.encoded += 5;
		}

		er.encoded += (2 * mlen) + tmper.encoded;
	}

	if(!xcan) ASN__TEXT_INDENT(1, ilevel - 1);

	if(encs) {
		xer_tmp_enc_t *enc = encs;
		xer_tmp_enc_t *end = encs + encs_count;
		ssize_t control_size = 0;

		cb = original_cb;
		app_key = original_app_key;
		qsort(encs, encs_count, sizeof(encs[0]), SET_OF_xer_order);

		for(; enc < end; enc++) {
			ASN__CALLBACK(enc->buffer, enc->offset);
			FREEMEM(enc->buffer);
			enc->buffer = 0;
			control_size += enc->offset;
		}
		assert(control_size == er.encoded);
	}

	goto cleanup;
cb_failed:
	er.encoded = -1;
	er.failed_type = td;
	er.structure_ptr = sptr;
cleanup:
	if(encs) {
		while(encs_count-- > 0) {
			if(encs[encs_count].buffer)
				FREEMEM(encs[encs_count].buffer);
		}
		FREEMEM(encs);
	}
	ASN__ENCODED_OK(er);
}